

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCore.c
# Opt level: O0

Cnf_Dat_t * Cnf_DeriveWithMan(Cnf_Man_t *p,Aig_Man_t *pAig,int nOutputs)

{
  abctime aVar1;
  Aig_MmFixed_t *p_00;
  abctime aVar2;
  Vec_Ptr_t *vMapped_00;
  Cnf_Dat_t *pCVar3;
  abctime clk;
  Aig_MmFixed_t *pMemCuts;
  Vec_Ptr_t *vMapped;
  Cnf_Dat_t *pCnf;
  int nOutputs_local;
  Aig_Man_t *pAig_local;
  Cnf_Man_t *p_local;
  
  p->pManAig = pAig;
  aVar1 = Abc_Clock();
  p_00 = Dar_ManComputeCuts(pAig,10,0,0);
  aVar2 = Abc_Clock();
  p->timeCuts = aVar2 - aVar1;
  aVar1 = Abc_Clock();
  Cnf_DeriveMapping(p);
  aVar2 = Abc_Clock();
  p->timeMap = aVar2 - aVar1;
  aVar1 = Abc_Clock();
  Cnf_ManTransferCuts(p);
  vMapped_00 = Cnf_ManScanMapping(p,1,1);
  pCVar3 = Cnf_ManWriteCnf(p,vMapped_00,nOutputs);
  Vec_PtrFree(vMapped_00);
  Aig_MmFixedStop(p_00,0);
  aVar2 = Abc_Clock();
  p->timeSave = aVar2 - aVar1;
  Aig_ManResetRefs(pAig);
  return pCVar3;
}

Assistant:

Cnf_Dat_t * Cnf_DeriveWithMan( Cnf_Man_t * p, Aig_Man_t * pAig, int nOutputs )
{
    Cnf_Dat_t * pCnf;
    Vec_Ptr_t * vMapped;
    Aig_MmFixed_t * pMemCuts;
    abctime clk;
    // connect the managers
    p->pManAig = pAig;

    // generate cuts for all nodes, assign cost, and find best cuts
clk = Abc_Clock();
    pMemCuts = Dar_ManComputeCuts( pAig, 10, 0, 0 );
p->timeCuts = Abc_Clock() - clk;

    // find the mapping
clk = Abc_Clock();
    Cnf_DeriveMapping( p );
p->timeMap = Abc_Clock() - clk;
//    Aig_ManScanMapping( p, 1 );

    // convert it into CNF
clk = Abc_Clock();
    Cnf_ManTransferCuts( p );
    vMapped = Cnf_ManScanMapping( p, 1, 1 );
    pCnf = Cnf_ManWriteCnf( p, vMapped, nOutputs );
    Vec_PtrFree( vMapped );
    Aig_MmFixedStop( pMemCuts, 0 );
p->timeSave = Abc_Clock() - clk;

   // reset reference counters
    Aig_ManResetRefs( pAig );
//ABC_PRT( "Cuts   ", p->timeCuts );
//ABC_PRT( "Map    ", p->timeMap  );
//ABC_PRT( "Saving ", p->timeSave );
    return pCnf;
}